

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O0

ion_err_t ion_fremove(char *name)

{
  int iVar1;
  int status;
  char *name_local;
  
  iVar1 = remove(name);
  if (iVar1 == 0) {
    name_local._7_1_ = '\0';
  }
  else {
    name_local._7_1_ = '\v';
  }
  return name_local._7_1_;
}

Assistant:

ion_err_t
ion_fremove(
	char *name
) {
	int status;

	status = fremove(name);

	if (0 == status) {
		return err_ok;
	}
	else {
		return err_file_delete_error;
	}
}